

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

int __thiscall
HashMap<String,_(anonymous_namespace)::AddrInfo>::remove
          (HashMap<String,_(anonymous_namespace)::AddrInfo> *this,char *__filename)

{
  Item *this_00;
  Item *pIVar1;
  Item *pIVar2;
  Item **ppIVar3;
  
  this_00 = (this->_end).item;
  pIVar1 = this_00->nextCell;
  *this_00->cell = pIVar1;
  if (pIVar1 != (Item *)0x0) {
    pIVar1->cell = this_00->cell;
  }
  pIVar1 = this_00->prev;
  pIVar2 = this_00->next;
  ppIVar3 = (Item **)&DAT_00123750;
  if (pIVar1 != (Item *)0x0) {
    ppIVar3 = &pIVar1->next;
  }
  *ppIVar3 = pIVar2;
  pIVar2->prev = pIVar1;
  _DAT_00123758 = _DAT_00123758 + -1;
  String::~String(&this_00->key);
  pIVar1 = DAT_001237c8;
  this_00->prev = DAT_001237c8;
  DAT_001237c8 = this_00;
  return (int)pIVar1;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;

    if((*item->cell = item->nextCell))
      item->nextCell->cell = item->cell;

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;

    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }